

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O3

string * RemoveNewlines_abi_cxx11_(string *__return_storage_ptr__,char *in)

{
  string *psVar1;
  string *psVar2;
  string *psVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar1 = (string *)strlen(in);
  psVar2 = psVar1;
  if (psVar1 != (string *)0x0) {
    psVar3 = (string *)0x0;
    do {
      psVar2 = (string *)CONCAT71((int7)((ulong)psVar2 >> 8),in[(long)psVar3]);
      if (in[(long)psVar3] != '\n') {
        psVar2 = (string *)std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      psVar3 = (string *)((long)&(psVar3->_M_dataplus)._M_p + 1);
    } while (psVar1 != psVar3);
  }
  return psVar2;
}

Assistant:

static std::string RemoveNewlines(const char *in) {
  std::string ret;
  const size_t in_len = strlen(in);

  for (size_t i = 0; i < in_len; i++) {
    if (in[i] != '\n') {
      ret.push_back(in[i]);
    }
  }

  return ret;
}